

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O3

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<5>::
EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<5> *this,PointDVectorIterator begin,
          PointDVectorIterator end)

{
  vector<unsigned_int,_std::allocator<unsigned_int>_> *__x;
  uint32_t uVar1;
  pointer pvVar2;
  void *pvVar3;
  pointer puVar4;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *pEVar5;
  uint *puVar6;
  long lVar7;
  PointDVector<unsigned_int> *pPVar8;
  PointDVectorIterator PVar9;
  PointDVectorIterator PVar10;
  uint uVar11;
  ulong uVar12;
  size_t sVar13;
  _Elt_pointer pEVar14;
  ulong uVar15;
  size_t sVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  ulong uVar22;
  uint32_t uVar23;
  uint uVar24;
  PointDVectorIterator split;
  stack<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  status_stack;
  int local_150;
  undefined4 uStack_14c;
  PointDVector<unsigned_int> *pPStack_148;
  uint32_t local_140;
  undefined4 uStack_13c;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_138;
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  local_f8;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> local_a8;
  DirectBitEncoder *local_60;
  FoldedBit32Encoder<draco::RAnsBitEncoder> *local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  PointDVector<unsigned_int> *local_38;
  
  PVar10 = end;
  PVar9 = begin;
  local_a8.begin.item_ = local_a8.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_a8,(allocator_type *)&local_138)
  ;
  pvVar2 = (this->base_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = *(pointer *)
            ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_f8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_f8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3,(long)puVar4 - (long)pvVar3),
     local_f8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_f8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_f8._M_impl.super__Deque_impl_data._M_map);
  }
  local_a8.begin.item_ = local_a8.begin.item_ & 0xffffffff00000000;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,
             (ulong)this->dimension_,(value_type_conflict5 *)&local_a8,(allocator_type *)&local_138)
  ;
  pvVar2 = (this->levels_stack_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar4 = *(pointer *)
            ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data + 0x10);
  *(_Map_pointer *)
   &(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
    super__Vector_impl_data = local_f8._M_impl.super__Deque_impl_data._M_map;
  *(size_t *)
   ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 8) = local_f8._M_impl.super__Deque_impl_data._M_map_size;
  *(_Elt_pointer *)
   ((long)&(pvVar2->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data + 0x10) = local_f8._M_impl.super__Deque_impl_data._M_start._M_cur
  ;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  if ((pvVar3 != (void *)0x0) &&
     (operator_delete(pvVar3,(long)puVar4 - (long)pvVar3),
     local_f8._M_impl.super__Deque_impl_data._M_map != (_Map_pointer)0x0)) {
    operator_delete(local_f8._M_impl.super__Deque_impl_data._M_map,
                    (long)local_f8._M_impl.super__Deque_impl_data._M_start._M_cur -
                    (long)local_f8._M_impl.super__Deque_impl_data._M_map);
  }
  local_a8.begin.dimensionality_ = begin.dimensionality_;
  local_a8.begin._20_4_ = begin._20_4_;
  local_a8.begin.item_ = PVar9.item_;
  pPVar8 = PVar9.vec_;
  local_a8.end.item_ = end.item_;
  sVar13 = local_a8.end.item_;
  local_a8.end.vec_ = end.vec_;
  local_a8.end.dimensionality_ = end.dimensionality_;
  local_a8.end._20_4_ = end._20_4_;
  local_a8.last_axis = 0;
  local_a8.stack_pos = 0;
  local_a8.end.item_._0_4_ = (int)PVar10.item_;
  local_a8.num_remaining_points = (int)local_a8.end.item_ - (int)begin.item_;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_f8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_a8.begin.vec_ = pPVar8;
  local_a8.end.item_ = sVar13;
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::_M_initialize_map(&local_f8,0);
  if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
    ::
    _M_push_back_aux<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>const&>
              ((deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                *)&local_f8,&local_a8);
  }
  else {
    (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->last_axis = local_a8.last_axis;
    (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->num_remaining_points =
         local_a8.num_remaining_points;
    *(ulong *)&(local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->stack_pos =
         CONCAT44(local_a8._60_4_,local_a8.stack_pos);
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).vec_ = local_a8.end.vec_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).dimensionality_ =
         local_a8.end.dimensionality_;
    *(undefined4 *)&((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).field_0x14 =
         local_a8.end._20_4_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).dimensionality_ =
         local_a8.begin.dimensionality_;
    *(undefined4 *)&((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).field_0x14 =
         local_a8.begin._20_4_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->end).item_ = local_a8.end.item_;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).item_ = local_a8.begin.item_
    ;
    ((local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur)->begin).vec_ = local_a8.begin.vec_;
    local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur =
         local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + 1;
  }
  if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
      local_f8._M_impl.super__Deque_impl_data._M_start._M_cur) {
    local_60 = &this->half_encoder_;
    local_58 = &this->numbers_encoder_;
    local_38 = pPVar8;
    do {
      if (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_f8._M_impl.super__Deque_impl_data._M_finish._M_first) {
        pEVar5 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        sVar13 = pEVar5[7].begin.item_;
        sVar16 = pEVar5[7].end.item_;
        uVar23 = pEVar5[7].last_axis;
        uVar21 = pEVar5[7].stack_pos;
        operator_delete(local_f8._M_impl.super__Deque_impl_data._M_finish._M_first,0x200);
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_first =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_node[-1];
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_last =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 8;
        pEVar14 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_first + 7;
        local_f8._M_impl.super__Deque_impl_data._M_finish._M_node =
             local_f8._M_impl.super__Deque_impl_data._M_finish._M_node + -1;
      }
      else {
        pEVar14 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur + -1;
        sVar13 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].begin.item_;
        sVar16 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].end.item_;
        uVar23 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].last_axis;
        uVar21 = local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur[-1].stack_pos;
      }
      uVar22 = (ulong)uVar21;
      begin.item_._0_4_ = (int)sVar13;
      pvVar2 = (this->levels_stack_).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar15 = (ulong)(uVar23 + 1);
      if (this->dimension_ - 1 == uVar23) {
        uVar15 = 0;
      }
      uVar23 = this->bit_length_;
      uVar1 = *(uint32_t *)
               (*(long *)&pvVar2[uVar22].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data + uVar15 * 4);
      local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur = pEVar14;
      if (uVar23 != uVar1) {
        uVar11 = (uint)(sVar16 - sVar13);
        uVar24 = (uint)uVar15;
        if (uVar11 < 3) {
          puVar4 = (this->axes_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          *puVar4 = uVar24;
          uVar12 = (ulong)this->dimension_;
          if (1 < this->dimension_) {
            uVar17 = 1;
            do {
              uVar21 = (int)uVar15 + 1;
              if ((int)uVar15 == (int)uVar12 + -1) {
                uVar21 = 0;
              }
              puVar4[uVar17] = uVar21;
              uVar17 = uVar17 + 1;
              uVar12 = (ulong)this->dimension_;
              uVar15 = (ulong)uVar21;
            } while (uVar17 < uVar12);
          }
          if (uVar11 != 0) {
            uVar17 = 0;
            uVar15 = uVar12;
            do {
              if ((int)uVar15 == 0) {
                uVar15 = 0;
              }
              else {
                uVar21 = local_38->dimensionality_;
                puVar6 = local_38->data0_;
                uVar19 = 0;
                do {
                  uVar15 = (ulong)(this->axes_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[uVar19];
                  iVar20 = this->bit_length_ -
                           *(int *)(*(long *)&pvVar2[uVar22].
                                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                              ._M_impl.super__Vector_impl_data + uVar15 * 4);
                  if (iVar20 != 0) {
                    DirectBitEncoder::EncodeLeastSignificantBits32
                              (&this->remaining_bits_encoder_,iVar20,
                               puVar6[(ulong)uVar21 * (sVar13 + uVar17) + uVar15]);
                    uVar12 = (ulong)this->dimension_;
                  }
                  uVar19 = uVar19 + 1;
                  uVar15 = uVar12;
                } while (uVar19 < uVar12);
              }
              uVar17 = uVar17 + 1;
            } while (uVar17 != (uVar11 & 3));
          }
        }
        else {
          pvVar2 = (this->base_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          uVar12 = (ulong)(uVar21 + 1);
          local_50 = uVar12;
          local_48 = uVar22;
          local_40 = uVar22;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                    (pvVar2 + uVar12,pvVar2 + uVar22);
          lVar7 = *(long *)&(this->base_stack_).
                            super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar12].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data;
          uVar21 = (1 << ((char)uVar23 + ~(byte)uVar1 & 0x1f)) + *(int *)(lVar7 + uVar15 * 4);
          *(uint *)(lVar7 + uVar15 * 4) = uVar21;
          std::
          __partition<draco::PointDVector<unsigned_int>::PointDVectorIterator,draco::DynamicIntegerPointsKdTreeEncoder<5>::Splitter>
                    (&local_150,(ulong)uVar21 << 0x20 | uVar15);
          uVar21 = (int)sVar16 - local_150;
          uVar18 = local_150 - (int)begin.item_;
          if (uVar18 != uVar21) {
            DirectBitEncoder::EncodeBit(local_60,uVar18 < uVar21);
          }
          iVar20 = 0x1f;
          if (uVar11 != 0) {
            for (; uVar11 >> iVar20 == 0; iVar20 = iVar20 + -1) {
            }
          }
          if (uVar18 < uVar21) {
            uVar21 = uVar18;
          }
          FoldedBit32Encoder<draco::RAnsBitEncoder>::EncodeLeastSignificantBits32
                    (local_58,iVar20,((uint)(sVar16 - sVar13 >> 1) & 0x7fffffff) - uVar21);
          pvVar2 = (this->levels_stack_).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          __x = pvVar2 + local_40;
          puVar4 = (__x->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar15;
          *puVar4 = *puVar4 + 1;
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=(pvVar2 + uVar12,__x);
          if (CONCAT44(uStack_14c,local_150) != sVar13) {
            local_138.begin.dimensionality_ = begin.dimensionality_;
            local_138.begin._20_4_ = begin._20_4_;
            local_138.end.dimensionality_ = local_140;
            local_138.end._20_4_ = uStack_13c;
            local_138.end.item_ = CONCAT44(uStack_14c,local_150);
            local_138.end.vec_ = pPStack_148;
            local_138.stack_pos = (uint32_t)local_48;
            local_138.num_remaining_points = local_150 - (int)begin.item_;
            local_138.begin.item_ = sVar13;
            local_138.begin.vec_ = pPVar8;
            local_138.last_axis = uVar24;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_f8,&local_138);
            sVar13 = CONCAT44(uStack_14c,local_150);
          }
          if (sVar13 != sVar16) {
            local_138.begin.dimensionality_ = local_140;
            local_138.begin._20_4_ = uStack_13c;
            local_138.begin.item_ = CONCAT44(uStack_14c,local_150);
            local_138.begin.vec_ = pPStack_148;
            local_138.end.dimensionality_ = end.dimensionality_;
            local_138.end._20_4_ = end._20_4_;
            local_138.end.vec_ = end.vec_;
            local_138.stack_pos = (uint32_t)local_50;
            local_138.num_remaining_points = (int)sVar16 - local_150;
            local_138.end.item_ = sVar16;
            local_138.last_axis = uVar24;
            std::
            deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
            ::
            emplace_back<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>
                      ((deque<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>
                        *)&local_f8,&local_138);
          }
        }
      }
    } while (local_f8._M_impl.super__Deque_impl_data._M_finish._M_cur !=
             local_f8._M_impl.super__Deque_impl_data._M_start._M_cur);
  }
  std::
  _Deque_base<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<5>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>
  ::~_Deque_base(&local_f8);
  return;
}

Assistant:

void DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodeInternal(
    RandomAccessIteratorT begin, RandomAccessIteratorT end) {
  typedef EncodingStatus<RandomAccessIteratorT> Status;

  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  Status init_status(begin, end, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    Status status = status_stack.top();
    status_stack.pop();

    begin = status.begin;
    end = status.end;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    const uint32_t axis =
        GetAndEncodeAxis(begin, end, old_base, levels, last_axis);
    const uint32_t level = levels[axis];
    const uint32_t num_remaining_points = static_cast<uint32_t>(end - begin);

    // If this happens all axis are subdivided to the end.
    if ((bit_length_ - level) == 0) {
      continue;
    }

    // Fast encoding of remaining bits if number of points is 1 or 2.
    // Doing this also for 2 gives a slight additional speed up.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        const auto &p = *(begin + i);
        for (uint32_t j = 0; j < dimension_; j++) {
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            remaining_bits_encoder_.EncodeLeastSignificantBits32(
                num_remaining_bits, p[axes_[j]]);
          }
        }
      }
      continue;
    }

    const uint32_t num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;  // copy
    base_stack_[stack_pos + 1][axis] += modifier;
    const VectorUint32 &new_base = base_stack_[stack_pos + 1];

    const RandomAccessIteratorT split =
        std::partition(begin, end, Splitter(axis, new_base[axis]));

    DRACO_DCHECK_EQ(true, (end - begin) > 0);

    // Encode number of points in first and second half.
    const int required_bits = MostSignificantBit(num_remaining_points);

    const uint32_t first_half = static_cast<uint32_t>(split - begin);
    const uint32_t second_half = static_cast<uint32_t>(end - split);
    const bool left = first_half < second_half;

    if (first_half != second_half) {
      half_encoder_.EncodeBit(left);
    }

    if (left) {
      EncodeNumber(required_bits, num_remaining_points / 2 - first_half);
    } else {
      EncodeNumber(required_bits, num_remaining_points / 2 - second_half);
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (split != begin) {
      status_stack.push(Status(begin, split, axis, stack_pos));
    }
    if (split != end) {
      status_stack.push(Status(split, end, axis, stack_pos + 1));
    }
  }
}